

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O0

void __thiscall
Iir::Butterworth::BandStopBase::setup
          (BandStopBase *this,int order,double centerFrequency,double widthFrequency)

{
  undefined4 in_ESI;
  LayoutBase *in_XMM0_Qa;
  int in_stack_0000000c;
  AnalogLowPass *in_stack_00000010;
  LayoutBase *in_stack_000000b0;
  LayoutBase *in_stack_000000b8;
  double in_stack_000000c0;
  double in_stack_000000c8;
  BandStopTransform *in_stack_000000d0;
  undefined4 in_stack_fffffffffffffff0;
  
  AnalogLowPass::design(in_stack_00000010,in_stack_0000000c);
  BandStopTransform::BandStopTransform
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
             in_stack_000000b0);
  Cascade::setLayout((Cascade *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_XMM0_Qa);
  return;
}

Assistant:

void BandStopBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency)
{
  m_analogProto.design (order);

  BandStopTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}